

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::_Test_GetFromImmutableLayer::_RunIt(void)

{
  undefined1 local_a8 [8];
  _Test_GetFromImmutableLayer t;
  
  _Test_GetFromImmutableLayer((_Test_GetFromImmutableLayer *)local_a8);
  _Run((_Test_GetFromImmutableLayer *)local_a8);
  ~_Test_GetFromImmutableLayer((_Test_GetFromImmutableLayer *)local_a8);
  return;
}

Assistant:

TEST(DBTest, GetFromImmutableLayer) {
  do {
    Options options = CurrentOptions();
    options.env = env_;
    options.write_buffer_size = 100000;  // Small write buffer
    Reopen(&options);

    ASSERT_OK(Put("foo", "v1"));
    ASSERT_EQ("v1", Get("foo"));

    // Block sync calls.
    env_->delay_data_sync_.store(true, std::memory_order_release);
    Put("k1", std::string(100000, 'x'));  // Fill memtable.
    Put("k2", std::string(100000, 'y'));  // Trigger compaction.
    ASSERT_EQ("v1", Get("foo"));
    // Release sync calls.
    env_->delay_data_sync_.store(false, std::memory_order_release);
  } while (ChangeOptions());
}